

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Dimension_ConstantDimension::CopyFrom
          (Dimension_ConstantDimension *this,Dimension_ConstantDimension *from)

{
  Dimension_ConstantDimension *from_local;
  Dimension_ConstantDimension *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void Dimension_ConstantDimension::CopyFrom(const Dimension_ConstantDimension& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.MILSpec.Dimension.ConstantDimension)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}